

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O2

void __thiscall
re2::PrefilterTree::Compile
          (PrefilterTree *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *atom_vec)

{
  _Rb_tree_header *p_Var1;
  pointer pEVar2;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  bool bVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  size_t i;
  ulong uVar6;
  iterator it;
  LogMessageFatal local_1b0;
  
  if (this->compiled_ == true) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prefilter_tree.cc"
               ,0x54);
    std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Compile after Compile.");
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  else if ((this->prefilter_vec_).
           super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (this->prefilter_vec_).
           super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    this->compiled_ = true;
    AssignUniqueIds(this,atom_vec);
    uVar6 = 0;
    while( true ) {
      pEVar2 = (this->entries_).
               super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->entries_).
                         super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2) / 0x28) <= uVar6
         ) break;
      this_00 = &(pEVar2[uVar6].parents)->_M_t;
      if (8 < (this_00->_M_impl).super__Rb_tree_header._M_node_count) {
        p_Var1 = &(this_00->_M_impl).super__Rb_tree_header;
        bVar3 = true;
        p_Var5 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
        for (p_Var4 = p_Var5; (_Rb_tree_header *)p_Var4 != p_Var1;
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
          if (bVar3) {
            bVar3 = 1 < pEVar2[(int)p_Var4[1]._M_color].propagate_up_at_count;
          }
          else {
            bVar3 = false;
          }
        }
        if (bVar3) {
          for (; (_Rb_tree_header *)p_Var5 != p_Var1;
              p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
            pEVar2[(int)p_Var5[1]._M_color].propagate_up_at_count =
                 pEVar2[(int)p_Var5[1]._M_color].propagate_up_at_count + -1;
          }
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::clear(this_00);
        }
      }
      uVar6 = uVar6 + 1;
    }
  }
  return;
}

Assistant:

void PrefilterTree::Compile(vector<string>* atom_vec) {
  if (compiled_) {
    LOG(DFATAL) << "Compile after Compile.";
    return;
  }

  // We do this check to support some legacy uses of
  // PrefilterTree that call Compile before adding any regexps,
  // and expect Compile not to have effect.
  if (prefilter_vec_.empty())
    return;

  compiled_ = true;

  AssignUniqueIds(atom_vec);

  // Identify nodes that are too common among prefilters and are
  // triggering too many parents. Then get rid of them if possible.
  // Note that getting rid of a prefilter node simply means they are
  // no longer necessary for their parent to trigger; that is, we do
  // not miss out on any regexps triggering by getting rid of a
  // prefilter node.
  for (size_t i = 0; i < entries_.size(); i++) {
    StdIntMap* parents = entries_[i].parents;
    if (parents->size() > 8) {
      // This one triggers too many things. If all the parents are AND
      // nodes and have other things guarding them, then get rid of
      // this trigger. TODO(vsri): Adjust the threshold appropriately,
      // make it a function of total number of nodes?
      bool have_other_guard = true;
      for (StdIntMap::iterator it = parents->begin();
           it != parents->end(); ++it) {
        have_other_guard = have_other_guard &&
            (entries_[it->first].propagate_up_at_count > 1);
      }

      if (have_other_guard) {
        for (StdIntMap::iterator it = parents->begin();
             it != parents->end(); ++it)
          entries_[it->first].propagate_up_at_count -= 1;

        parents->clear();  // Forget the parents
      }
    }
  }

  PrintDebugInfo();
}